

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseImageCopy.c
# Opt level: O1

int TestSparseImageSplit(IceTImage image)

{
  IceTSizeType IVar1;
  IceTSizeType IVar2;
  IceTSizeType width;
  IceTSizeType IVar3;
  int iVar4;
  void *buffer;
  IceTSparseImage compressed_image;
  void *pvVar5;
  IceTSparseImage IVar6;
  long lVar7;
  ulong uVar8;
  IceTSizeType offsets [7];
  IceTSparseImage sparse_partition [7];
  IceTVoid *sparse_partition_buffer [7];
  IceTSizeType local_c8 [8];
  IceTSparseImage local_a8 [8];
  undefined8 auStack_68 [7];
  
  IVar1 = icetImageGetWidth(image);
  IVar2 = icetImageGetHeight(image);
  width = icetSparseImageSplitPartitionNumPixels(IVar2 * IVar1,7,7);
  IVar3 = icetSparseImageBufferSize(IVar1,IVar2);
  buffer = malloc((long)IVar3);
  compressed_image = icetSparseImageAssignBuffer(buffer,IVar1,IVar2);
  lVar7 = 0;
  do {
    IVar1 = icetSparseImageBufferSize(width,1);
    pvVar5 = malloc((long)IVar1);
    auStack_68[lVar7] = pvVar5;
    IVar6 = icetSparseImageAssignBuffer(pvVar5,width,1);
    local_a8[lVar7].opaque_internals = IVar6.opaque_internals;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  IVar1 = icetSparseImageBufferSize(width,1);
  pvVar5 = malloc((long)IVar1);
  IVar6 = icetSparseImageAssignBuffer(pvVar5,width,1);
  icetCompressImage(image,compressed_image);
  printf("Spliting image %d times\n");
  icetSparseImageSplit(compressed_image,0,7,7,local_a8,local_c8);
  uVar8 = 0;
  do {
    IVar1 = local_c8[uVar8];
    IVar2 = icetSparseImageGetNumPixels((IceTSparseImage)local_a8[uVar8].opaque_internals);
    icetCompressSubImage(image,IVar1,IVar2,IVar6);
    printf("    Comparing partition %d\n",uVar8 & 0xffffffff);
    iVar4 = CompareSparseImages(IVar6,(IceTSparseImage)local_a8[uVar8].opaque_internals);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 7);
  printf("Spliting image %d times with first partition in place.\n");
  local_a8[0] = compressed_image;
  icetSparseImageSplit(compressed_image,0,7,7,local_a8,local_c8);
  uVar8 = 0;
  do {
    IVar1 = local_c8[uVar8];
    IVar2 = icetSparseImageGetNumPixels((IceTSparseImage)local_a8[uVar8].opaque_internals);
    icetCompressSubImage(image,IVar1,IVar2,IVar6);
    printf("    Comparing partition %d\n",uVar8 & 0xffffffff);
    iVar4 = CompareSparseImages(IVar6,(IceTSparseImage)local_a8[uVar8].opaque_internals);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 7);
  free(buffer);
  lVar7 = 0;
  do {
    free((void *)auStack_68[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 7);
  free(pvVar5);
  return 0;
}

Assistant:

static int TestSparseImageSplit(const IceTImage image)
{
#define NUM_PARTITIONS 7
    IceTVoid *full_sparse_buffer;
    IceTSparseImage full_sparse;
    IceTVoid *sparse_partition_buffer[NUM_PARTITIONS];
    IceTSparseImage sparse_partition[NUM_PARTITIONS];
    IceTSizeType offsets[NUM_PARTITIONS];
    IceTVoid *compare_sparse_buffer;
    IceTSparseImage compare_sparse;

    IceTSizeType width;
    IceTSizeType height;
    IceTSizeType num_partition_pixels;

    IceTInt partition;

    width = icetImageGetWidth(image);
    height = icetImageGetHeight(image);
    num_partition_pixels
        = icetSparseImageSplitPartitionNumPixels(width*height,
                                                 NUM_PARTITIONS,
                                                 NUM_PARTITIONS);

    full_sparse_buffer = malloc(icetSparseImageBufferSize(width, height));
    full_sparse = icetSparseImageAssignBuffer(full_sparse_buffer,width,height);

    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        sparse_partition_buffer[partition]
            = malloc(icetSparseImageBufferSize(num_partition_pixels, 1));
        sparse_partition[partition]
            = icetSparseImageAssignBuffer(sparse_partition_buffer[partition],
                                          num_partition_pixels, 1);
    }

    compare_sparse_buffer
        = malloc(icetSparseImageBufferSize(num_partition_pixels, 1));
    compare_sparse
        = icetSparseImageAssignBuffer(compare_sparse_buffer,
                                      num_partition_pixels, 1);

    icetCompressImage(image, full_sparse);

    printf("Spliting image %d times\n", NUM_PARTITIONS);
    icetSparseImageSplit(full_sparse,
                         0,
                         NUM_PARTITIONS,
                         NUM_PARTITIONS,
                         sparse_partition,
                         offsets);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        IceTInt result;
        icetCompressSubImage(image,
                             offsets[partition],
                             icetSparseImageGetNumPixels(
                                                   sparse_partition[partition]),
                             compare_sparse);
        printf("    Comparing partition %d\n", partition);
        result = CompareSparseImages(compare_sparse,
                                     sparse_partition[partition]);
        if (result != TEST_PASSED) return result;
    }

    printf("Spliting image %d times with first partition in place.\n",
           NUM_PARTITIONS);
    sparse_partition[0] = full_sparse;
    icetSparseImageSplit(full_sparse,
                         0,
                         NUM_PARTITIONS,
                         NUM_PARTITIONS,
                         sparse_partition,
                         offsets);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        IceTInt result;
        icetCompressSubImage(image,
                             offsets[partition],
                             icetSparseImageGetNumPixels(
                                                   sparse_partition[partition]),
                             compare_sparse);
        printf("    Comparing partition %d\n", partition);
        result = CompareSparseImages(compare_sparse,
                                     sparse_partition[partition]);
        if (result != TEST_PASSED) return result;
    }

    free(full_sparse_buffer);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        free(sparse_partition_buffer[partition]);
    }
    free(compare_sparse_buffer);

    return TEST_PASSED;
#undef NUM_PARTITIONS
}